

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title-threadsafe.c
# Opt level: O3

void setter_thread_body(void *arg)

{
  int iVar1;
  uv_loop_t *loop;
  uv_loop_t *loop_00;
  int extraout_EDX;
  uint uVar2;
  ulong uVar3;
  uv_process_t *process;
  char *pcVar4;
  char *pcVar5;
  char *title;
  uv_handle_t *handle;
  uv_handle_t auStack_c70 [2];
  uv_loop_t *puStack_b68;
  code *pcStack_b60;
  code *pcStack_b58;
  undefined1 auStack_b48 [24];
  uv_close_cb p_Stack_b30;
  uv_close_cb p_Stack_b28;
  void *pvStack_b20;
  uv_process_options_t uStack_b18;
  uv_process_t uStack_ad8;
  undefined1 auStack_a50 [511];
  undefined1 uStack_851;
  uv_loop_t uStack_850;
  char *pcStack_450;
  char *pcStack_448;
  code *pcStack_440;
  char acStack_438 [512];
  code *pcStack_238;
  char acStack_230 [512];
  undefined8 uStack_30;
  
  uVar3 = 0x32;
  while( true ) {
    uStack_30 = 0x165ad6;
    iVar1 = uv_set_process_title
                      ("8L2NY0Kdj0XyNFZnmUZigIOfcWjyNr0SkMmUhKw99VLUsZFrvCQQC3XIRfNR8pjyMjXObllled")
    ;
    if (iVar1 != 0) break;
    uStack_30 = 0x165ae2;
    iVar1 = uv_set_process_title
                      ("jUAcscJN49oLSN8GdmXj2Wo34XX2T2vp2j5khfajNQarlOulp57cE130yiY53ipJFnPyTn5i82")
    ;
    if (iVar1 != 0) {
LAB_00165b15:
      uStack_30 = 0x165b1a;
      setter_thread_body_cold_2();
      break;
    }
    uStack_30 = 0x165aee;
    iVar1 = uv_set_process_title
                      ("9niCI5icXGFS72XudhXqo5alftmZ1tpE7B3cwUmrq0CCDjC84FzBNB8XAHqvpNQfI2QAQG6ztT")
    ;
    if (iVar1 != 0) {
LAB_00165b10:
      uStack_30 = 0x165b15;
      setter_thread_body_cold_3();
      goto LAB_00165b15;
    }
    uStack_30 = 0x165afa;
    iVar1 = uv_set_process_title
                      ("n8qXVXuG6IEHDpabJgTEiwtpY6LHMZ8MgznnMpdHARu5EywufA6hcBaQfetb0YhEsK0ykDd7JU")
    ;
    if (iVar1 != 0) {
      uStack_30 = 0x165b10;
      setter_thread_body_cold_4();
      goto LAB_00165b10;
    }
    uVar2 = (int)uVar3 - 1;
    uVar3 = (ulong)uVar2;
    if (uVar2 == 0) {
      return;
    }
  }
  uStack_30 = 0x165b1f;
  setter_thread_body_cold_1();
  pcVar5 = acStack_230;
  title = acStack_230;
  pcStack_238 = (code *)0x165b33;
  set_title("%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s");
  pcStack_238 = (code *)0x165b3f;
  set_title("new title");
  pcVar4 = (char *)0x0;
  pcStack_238 = (code *)0x165b4b;
  iVar1 = uv_get_process_title((char *)0x0,100);
  if (iVar1 == -0x16) {
    pcStack_238 = (code *)0x165b5a;
    iVar1 = uv_get_process_title(acStack_230,0);
    pcVar4 = pcVar5;
    if (iVar1 != -0x16) goto LAB_00165b80;
    pcStack_238 = (code *)0x165b6c;
    iVar1 = uv_get_process_title(acStack_230,1);
    if (iVar1 == -0x69) {
      return;
    }
  }
  else {
    pcStack_238 = (code *)0x165b80;
    run_test_process_title_cold_1();
LAB_00165b80:
    title = pcVar4;
    pcStack_238 = (code *)0x165b85;
    run_test_process_title_cold_2();
  }
  pcStack_238 = set_title;
  run_test_process_title_cold_3();
  pcStack_238 = (code *)0x19dbdc;
  pcStack_440 = (code *)0x165ba2;
  iVar1 = uv_get_process_title(acStack_438,0x200);
  if (iVar1 == 0) {
    pcStack_440 = (code *)0x165bae;
    iVar1 = uv_set_process_title(title);
    if (iVar1 != 0) goto LAB_00165be0;
    pcStack_440 = (code *)0x165bbf;
    iVar1 = uv_get_process_title(acStack_438,0x200);
    if (iVar1 != 0) goto LAB_00165be5;
    pcStack_440 = (code *)0x165bce;
    iVar1 = strcmp(acStack_438,title);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    pcStack_440 = (code *)0x165be0;
    set_title_cold_1();
LAB_00165be0:
    pcStack_440 = (code *)0x165be5;
    set_title_cold_2();
LAB_00165be5:
    pcStack_440 = (code *)0x165bea;
    set_title_cold_3();
  }
  pcStack_440 = run_test_process_title_big_argv;
  set_title_cold_4();
  pcStack_440 = (code *)0x19dc72;
  pcStack_448 = "jUAcscJN49oLSN8GdmXj2Wo34XX2T2vp2j5khfajNQarlOulp57cE130yiY53ipJFnPyTn5i82";
  process = (uv_process_t *)auStack_b48;
  auStack_b48._0_8_ = (void *)0x3ff;
  loop_00 = &uStack_850;
  pcStack_b58 = (code *)0x165c17;
  loop = loop_00;
  pcStack_450 = title;
  iVar1 = uv_exepath((char *)loop_00,(size_t *)process);
  if (iVar1 == 0) {
    *(undefined1 *)(auStack_b48._0_8_ + (long)(uStack_850.handle_queue + -2)) = 0;
    pcStack_b58 = (code *)0x165c49;
    memset(auStack_a50,0x78,0x1ff);
    uStack_851 = 0;
    uStack_b18.args = (char **)(auStack_b48 + 8);
    auStack_b48._16_8_ = "process_title_big_argv_helper";
    pvStack_b20 = (void *)0x0;
    uStack_b18.env = (char **)0x0;
    uStack_b18.cwd = (char *)0x0;
    uStack_b18.flags = 0;
    uStack_b18.stdio_count = 0;
    uStack_b18.stdio = (uv_stdio_container_t *)0x0;
    uStack_b18.uid = 0;
    uStack_b18.gid = 0;
    uStack_b18.exit_cb = exit_cb;
    pcStack_b58 = (code *)0x165c9c;
    auStack_b48._8_8_ = loop_00;
    p_Stack_b30 = (uv_close_cb)auStack_a50;
    p_Stack_b28 = (uv_close_cb)auStack_a50;
    uStack_b18.file = (char *)loop_00;
    loop = uv_default_loop();
    process = &uStack_ad8;
    pcStack_b58 = (code *)0x165cac;
    iVar1 = uv_spawn(loop,process,&uStack_b18);
    if (iVar1 != 0) goto LAB_00165d0b;
    pcStack_b58 = (code *)0x165cb5;
    loop = uv_default_loop();
    process = (uv_process_t *)0x0;
    pcStack_b58 = (code *)0x165cbf;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 == 0) {
      pcStack_b58 = (code *)0x165cc8;
      loop_00 = uv_default_loop();
      pcStack_b58 = (code *)0x165cdc;
      uv_walk(loop_00,close_walk_cb,(void *)0x0);
      process = (uv_process_t *)0x0;
      pcStack_b58 = (code *)0x165ce6;
      uv_run(loop_00,UV_RUN_DEFAULT);
      pcStack_b58 = (code *)0x165ceb;
      loop = uv_default_loop();
      pcStack_b58 = (code *)0x165cf3;
      iVar1 = uv_loop_close(loop);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00165d15;
    }
  }
  else {
    pcStack_b58 = (code *)0x165d0b;
    run_test_process_title_big_argv_cold_1();
LAB_00165d0b:
    pcStack_b58 = (code *)0x165d10;
    run_test_process_title_big_argv_cold_2();
  }
  pcStack_b58 = (code *)0x165d15;
  run_test_process_title_big_argv_cold_3();
LAB_00165d15:
  pcStack_b58 = exit_cb;
  run_test_process_title_big_argv_cold_4();
  if (process == (uv_process_t *)0x0) {
    if (extraout_EDX == 0) {
      uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
      return;
    }
  }
  else {
    pcStack_b60 = (code *)0x165d31;
    exit_cb_cold_1();
  }
  pcStack_b60 = process_title_big_argv;
  exit_cb_cold_2();
  handle = auStack_c70;
  puStack_b68 = loop_00;
  pcStack_b60 = (code *)uVar3;
  memset(auStack_c70,0,0x100);
  auStack_c70[0].data._0_4_ = 0x6c696166;
  uv_get_process_title((char *)auStack_c70,0x100);
  if (auStack_c70[0].data._4_1_ != '\0' || (int)auStack_c70[0].data != 0x6c696166) {
    return;
  }
  process_title_big_argv_cold_1();
  iVar1 = uv_is_closing(handle);
  if (iVar1 != 0) {
    return;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return;
}

Assistant:

static void setter_thread_body(void* arg) {
  int i;

  for (i = 0; i < NUM_ITERATIONS; i++) {
    ASSERT(0 == uv_set_process_title(titles[0]));
    ASSERT(0 == uv_set_process_title(titles[1]));
    ASSERT(0 == uv_set_process_title(titles[2]));
    ASSERT(0 == uv_set_process_title(titles[3]));
  }
}